

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::rangeToString<double_const*,double_const*>
          (string *__return_storage_ptr__,Detail *this,double *first,double *last)

{
  Detail *e;
  ReusableStringStream rss;
  ReusableStringStream RStack_58;
  string local_48;
  
  ReusableStringStream::ReusableStringStream(&RStack_58);
  std::operator<<(RStack_58.m_oss,"{ ");
  if (this != (Detail *)first) {
    stringify<double>(&local_48,(double *)this);
    std::operator<<(RStack_58.m_oss,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    for (e = this + 8; e != (Detail *)first; e = e + 8) {
      std::operator<<(RStack_58.m_oss,", ");
      stringify<double>(&local_48,(double *)e);
      std::operator<<(RStack_58.m_oss,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  std::operator<<(RStack_58.m_oss," }");
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,&RStack_58);
  ReusableStringStream::~ReusableStringStream(&RStack_58);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }